

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::torrent_peer::to_string_abi_cxx11_
          (string *__return_storage_ptr__,torrent_peer *this)

{
  char *__s;
  size_t sVar1;
  torrent_peer *ptVar2;
  address local_30;
  
  if ((*(uint *)&this->field_0x1b >> 0x19 & 1) == 0) {
    ptVar2 = this + 1;
    if ((*(uint *)&this->field_0x1b >> 0x18 & 1) == 0) {
      local_30._0_8_ = (ulong)ptVar2->prev_amount_upload << 0x20;
      local_30.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_30.ipv6_address_.addr_.__in6_u._8_8_ = (peer_connection_interface *)0x0;
    }
    else {
      local_30.ipv6_address_.addr_.__in6_u._0_4_ = ptVar2->prev_amount_upload;
      local_30.ipv6_address_.addr_.__in6_u._4_4_ = ptVar2->prev_amount_download;
      local_30.ipv6_address_.addr_.__in6_u._8_8_ = this[1].connection;
      local_30.type_ = ipv6;
      local_30.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    local_30.ipv6_address_.scope_id_ = 0;
    boost::asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,&local_30);
  }
  else {
    __s = *(char **)(this + 1);
    sVar1 = strlen(__s);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_peer::to_string() const
	{
		TORRENT_ASSERT(in_use);
#if TORRENT_USE_I2P
		if (is_i2p_addr) return std::string(dest());
#endif
		return address().to_string();
	}